

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

string * __thiscall
minja::error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
          (anon_class_8_1_6bb45959 *this,size_t line)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  ulong in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  string *in_RDI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  size_t i;
  const_iterator start;
  string *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  ulong local_28;
  
  this_00 = in_RDI;
  std::__cxx11::string::begin();
  for (local_28 = 1; local_28 < in_RDX; local_28 = local_28 + 1) {
    std::__cxx11::string::end();
    std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              (in_stack_ffffffffffffff68,in_RSI,(char *)this_00);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00,(difference_type)in_RDI);
  }
  std::__cxx11::string::end();
  __beg = std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                    (in_stack_ffffffffffffff68,in_RSI,(char *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (in_stack_ffffffffffffff70,__beg,in_stack_ffffffffffffff78,
             (allocator<char> *)in_stack_ffffffffffffff68._M_current);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return this_00;
}

Assistant:

static std::string error_location_suffix(const std::string & source, size_t pos) {
  auto get_line = [&](size_t line) {
    auto start = source.begin();
    for (size_t i = 1; i < line; ++i) {
      start = std::find(start, source.end(), '\n') + 1;
    }
    auto end = std::find(start, source.end(), '\n');
    return std::string(start, end);
  };
  auto start = source.begin();
  auto end = source.end();
  auto it = start + pos;
  auto line = std::count(start, it, '\n') + 1;
  auto max_line = std::count(start, end, '\n') + 1;
  auto col = pos - std::string(start, it).rfind('\n');
  std::ostringstream out;
  out << " at row " << line << ", column " << col << ":\n";
  if (line > 1) out << get_line(line - 1) << "\n";
  out << get_line(line) << "\n";
  out << std::string(col - 1, ' ') << "^\n";
  if (line < max_line) out << get_line(line + 1) << "\n";

  return out.str();
}